

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::handleErroEvent(UdpSocket *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  shared_ptr<Liby::UdpSocket> self;
  UdpSocket *this_local;
  
  self.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<Liby::UdpSocket>::shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20,&this->self_)
  ;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->erroEventCallback_);
  if (bVar1) {
    std::function<void_(Liby::UdpSocket_&)>::operator()(&this->erroEventCallback_,this);
  }
  destroy(this);
  std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20);
  return;
}

Assistant:

void UdpSocket::handleErroEvent() {
    auto self = self_;
    if (erroEventCallback_) {
        erroEventCallback_(*this);
    }
    destroy();
}